

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_executor.hpp
# Opt level: O3

void duckdb::GenericListType<duckdb::PrimitiveType<duckdb::timestamp_t>_>::AssignResult
               (Vector *result,idx_t i,
               GenericListType<duckdb::PrimitiveType<duckdb::timestamp_t>_> *value)

{
  pointer pPVar1;
  pointer pPVar2;
  data_ptr_t pdVar3;
  Vector *pVVar4;
  idx_t iVar5;
  reference pvVar6;
  size_type __n;
  long lVar7;
  
  pVVar4 = ListVector::GetEntry(result);
  iVar5 = ListVector::GetListSize(result);
  pPVar1 = (value->values).
           super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pPVar2 = (value->values).
           super_vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           .
           super__Vector_base<duckdb::PrimitiveType<duckdb::timestamp_t>,_std::allocator<duckdb::PrimitiveType<duckdb::timestamp_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)pPVar1 - (long)pPVar2 >> 3;
  ListVector::Reserve(result,iVar5 + lVar7);
  pdVar3 = result->data;
  *(idx_t *)(pdVar3 + i * 0x10) = iVar5;
  *(long *)(pdVar3 + i * 0x10 + 8) = lVar7;
  if (pPVar1 != pPVar2) {
    __n = 0;
    do {
      pvVar6 = vector<duckdb::PrimitiveType<duckdb::timestamp_t>,_true>::operator[]
                         (&value->values,__n);
      *(int64_t *)(pVVar4->data + __n * 8 + iVar5 * 8) = (pvVar6->val).value;
      __n = __n + 1;
    } while (lVar7 + (ulong)(lVar7 == 0) != __n);
  }
  ListVector::SetListSize(result,iVar5 + lVar7);
  return;
}

Assistant:

static void AssignResult(Vector &result, idx_t i, GenericListType<CHILD_TYPE> value) {
		auto &child = ListVector::GetEntry(result);
		auto current_size = ListVector::GetListSize(result);

		// reserve space in the child element
		auto list_size = value.values.size();
		ListVector::Reserve(result, current_size + list_size);

		auto list_entries = FlatVector::GetData<list_entry_t>(result);
		list_entries[i].offset = current_size;
		list_entries[i].length = list_size;

		for (idx_t child_idx = 0; child_idx < list_size; child_idx++) {
			CHILD_TYPE::AssignResult(child, current_size + child_idx, value.values[child_idx]);
		}
		ListVector::SetListSize(result, current_size + list_size);
	}